

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkResult
tonk_connect(TonkSocket tonkSocket,TonkConnectionConfig config,char *hostname,uint16_t port,
            TonkConnection *connectionOut,TonkJson *errorJsonOut)

{
  TonkConnectionConfig TVar1;
  fp_tonk_connect_t p_Var2;
  TonkConnection *in_RCX;
  uint16_t in_DX;
  char *in_RSI;
  TonkSocket in_RDI;
  TonkJson *in_R8;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_440;
  _func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *local_438;
  undefined1 local_430 [1024];
  TonkJson *local_30;
  TonkConnection *local_28;
  uint16_t local_1a;
  char *local_18;
  TonkResult local_4;
  
  p_Var2 = fp_tonk_connect;
  local_30 = in_R8;
  if (fp_tonk_connect == (fp_tonk_connect_t)0x0) {
    if (in_RCX != (TonkConnection *)0x0) {
      *in_RCX = (TonkConnection)0x0;
    }
    if (in_R8 != (TonkJson *)0x0) {
      memset(local_430,0,0x400);
      memcpy(local_30,local_430,0x400);
    }
    local_4 = Tonk_DLL_Not_Found;
  }
  else {
    local_28 = in_RCX;
    local_1a = in_DX;
    local_18 = in_RSI;
    memcpy(&local_458,&stack0x00000008,0x28);
    TVar1.OnConnect = (_func_void_TonkAppContextPtr_TonkConnection *)uStack_450;
    TVar1.AppContextPtr = (TonkAppContextPtr)local_458;
    TVar1.OnData = (_func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *)
                   uStack_448;
    TVar1.OnTick = (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)uStack_440;
    TVar1.OnClose = local_438;
    local_4 = (*p_Var2)(in_RDI,TVar1,local_18,local_1a,local_28,local_30);
  }
  return local_4;
}

Assistant:

TonkResult tonk_connect(
    TonkSocket          tonkSocket, // Socket to connect from
    TonkConnectionConfig    config, // Configuration for the connection
    const char*           hostname, // Hostname of the remote host
    uint16_t                  port, // Port for the remote host
    TonkConnection*  connectionOut, // Set to connection on success, else 0
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    if (!fp_tonk_connect)
    {
        if (connectionOut) {
            *connectionOut = nullptr;
        }
        if (errorJsonOut) {
            *errorJsonOut = TonkJson();
        }
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_connect(
        tonkSocket,
        config,
        hostname,
        port,
        connectionOut,
        errorJsonOut);
}